

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *
__thiscall
kj::_::
NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>::
operator=(NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *this,NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
                (&(this->field_1).value);
    }
    if (other->isSet == true) {
      capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::RemotePromise
                (&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }